

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O3

bool __thiscall
CLOptions::SetParam(CLOptions *this,string *opt_name,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *opt_vals)

{
  string *psVar1;
  pointer pbVar2;
  pointer pcVar3;
  const_iterator cVar4;
  mapped_type *ppCVar5;
  const_iterator cVar6;
  mapped_type *ppCVar7;
  const_iterator cVar8;
  mapped_type *ppCVar9;
  const_iterator cVar10;
  mapped_type *ppCVar11;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
          ::find(&(this->params_bools)._M_t,opt_name);
  if ((_Rb_tree_header *)cVar4._M_node == &(this->params_bools)._M_t._M_impl.super__Rb_tree_header)
  {
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
            ::find(&(this->params_doubles)._M_t,opt_name);
    if ((_Rb_tree_header *)cVar6._M_node ==
        &(this->params_doubles)._M_t._M_impl.super__Rb_tree_header) {
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
              ::find(&(this->params_ints)._M_t,opt_name);
      if ((_Rb_tree_header *)cVar8._M_node ==
          &(this->params_ints)._M_t._M_impl.super__Rb_tree_header) {
        cVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                 ::find(&(this->params_strings)._M_t,opt_name);
        if ((_Rb_tree_header *)cVar10._M_node ==
            &(this->params_strings)._M_t._M_impl.super__Rb_tree_header) {
          return false;
        }
        pbVar2 = (opt_vals->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pcVar3 = (pbVar2->_M_dataplus)._M_p;
        local_40[0] = local_30;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_40,pcVar3,pcVar3 + pbVar2->_M_string_length);
        ppCVar11 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                   ::operator[](&this->params_strings,opt_name);
        std::__cxx11::string::_M_assign
                  ((string *)
                   &((*ppCVar11)->
                    super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).value);
        if (local_40[0] == local_30) {
          return true;
        }
        operator_delete(local_40[0]);
        return true;
      }
      psVar1 = (opt_vals->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppCVar9 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
                ::operator[](&this->params_ints,opt_name);
      CLInt::operator=(*ppCVar9,psVar1);
    }
    else {
      psVar1 = (opt_vals->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppCVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                ::operator[](&this->params_doubles,opt_name);
      CLDouble::operator=(*ppCVar7,psVar1);
    }
  }
  else {
    psVar1 = (opt_vals->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppCVar5 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
              ::operator[](&this->params_bools,opt_name);
    CLBool::operator=(*ppCVar5,psVar1);
  }
  return true;
}

Assistant:

bool CLOptions::SetParam(const std::string& opt_name,
                         std::vector<std::string> opt_vals)
{
    // Special check for the version parameter
    
    
    // Fill in the correct variable
    if (params_bools.count(opt_name) > 0) {
        *params_bools[opt_name] = opt_vals.front() ;
    } else if (params_doubles.count(opt_name) > 0) {
        *params_doubles[opt_name] = opt_vals.front() ;
    } else if (params_ints.count(opt_name) > 0) {
        *params_ints[opt_name] = opt_vals.front() ;
    } else if (params_strings.count(opt_name) > 0) {
        *params_strings[opt_name] = opt_vals.front() ;
    } else {
        return false ;
    }
    
    return true ;
}